

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_variable_fwd.hpp
# Opt level: O2

bool __thiscall
boost::condition_variable::do_wait_for
          (condition_variable *this,unique_lock<boost::mutex> *lock,timespec *timeout)

{
  bool bVar1;
  timespec local_38;
  timespec local_28;
  
  local_38 = detail::timespec_now_realtime();
  local_28 = detail::timespec_plus(timeout,&local_38);
  bVar1 = do_wait_until(this,lock,&local_28);
  return bVar1;
}

Assistant:

bool do_wait_for(
            unique_lock<mutex>& lock,
            struct timespec const &timeout)
        {
#if defined BOOST_THREAD_HAS_CONDATTR_SET_CLOCK_MONOTONIC
            return do_wait_until(lock, boost::detail::timespec_plus(timeout, boost::detail::timespec_now_monotonic()));
#else
            // old behavior was fine for monotonic
            return do_wait_until(lock, boost::detail::timespec_plus(timeout, boost::detail::timespec_now_realtime()));
#endif
        }